

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  long *plVar1;
  Action *action;
  long lVar2;
  pointer pTVar3;
  char *in_R8;
  long lVar4;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  long *plVar5;
  ActionResult AVar6;
  ScriptValidator validator;
  Validator module_validator;
  ScriptValidator local_2f0;
  anon_union_8_2_516a9242_for_ActionResult_2 local_2d0;
  TypeVector local_2c8;
  Validator local_2a8;
  
  local_2f0.result_.enum_ = Ok;
  plVar1 = *(long **)&script->field_0x8;
  local_2f0.script_ = script;
  local_2f0.errors_ = errors;
  local_2f0.options_ = options;
  for (plVar5 = *(long **)script; plVar5 != plVar1; plVar5 = plVar5 + 1) {
    lVar4 = *plVar5;
    switch(*(undefined4 *)(lVar4 + 8)) {
    case 0:
      local_2a8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_00198270;
      local_2a8.options_ = local_2f0.options_;
      local_2a8.errors_ = local_2f0.errors_;
      SharedValidator::SharedValidator(&local_2a8.validator_,local_2f0.errors_,local_2f0.options_);
      local_2a8.result_.enum_ = Ok;
      local_2a8.current_module_ = (Module *)(lVar4 + 0x10);
      anon_unknown_4::Validator::CheckModule(&local_2a8);
      local_2a8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_00198270;
      SharedValidator::~SharedValidator(&local_2a8.validator_);
      break;
    case 1:
    case 8:
    case 9:
      anon_unknown_4::ScriptValidator::CheckAction(&local_2f0,*(Action **)(lVar4 + 0x10));
      break;
    case 7:
      action = *(Action **)(lVar4 + 0x10);
      AVar6 = anon_unknown_4::ScriptValidator::CheckAction(&local_2f0,action);
      local_2d0 = AVar6.field_1;
      local_2a8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
      local_2a8.options_ = (ValidateOptions *)0x0;
      local_2a8.errors_ = (Errors *)0x0;
      lVar2 = *(long *)(lVar4 + 0x20);
      for (lVar4 = *(long *)(lVar4 + 0x18); lVar4 != lVar2; lVar4 = lVar4 + 0x48) {
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               *(Enum *)(lVar4 + 0x20));
        if ((Errors *)local_2a8.options_ == local_2a8.errors_) {
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_realloc_insert<wabt::Type>
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2a8,
                     (iterator)local_2a8.options_,(Type *)&local_2c8);
        }
        else {
          *(Enum *)&(local_2a8.options_)->features = *(Enum *)(lVar4 + 0x20);
          local_2a8.options_ = (ValidateOptions *)((long)local_2a8.options_ + 4);
        }
      }
      if (AVar6.kind == Types) {
        anon_unknown_4::ScriptValidator::CheckResultTypes
                  (&local_2f0,(Location *)(action + 8),(TypeVector *)&local_2a8,local_2d0.types,
                   in_R8);
      }
      else if (AVar6.kind == Type) {
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar3 = (pointer)operator_new(4);
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar3 + 1;
        pTVar3->enum_ = local_2d0.type.enum_.enum_;
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = pTVar3;
        local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_2c8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
        anon_unknown_4::ScriptValidator::CheckResultTypes
                  (&local_2f0,(Location *)(action + 8),(TypeVector *)&local_2a8,&local_2c8,in_R8);
        operator_delete(pTVar3);
      }
      if (local_2a8.super_Delegate._vptr_Delegate != (_func_int **)0x0) {
        operator_delete(local_2a8.super_Delegate._vptr_Delegate);
      }
    }
  }
  return (Result)local_2f0.result_.enum_;
}

Assistant:

ScriptValidator::ScriptValidator(Errors* errors,
                                 const Script* script,
                                 const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {}